

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

void __thiscall cg_other::set(cg_other *this,point p,int ch)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  cgo_char local_10;
  
  pcVar1 = (this->data).super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    if ((ulong)(((long)(this->data).
                       super__Vector_base<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) / 0xc) <= uVar3) {
      local_10.p = p;
      local_10.ch = ch;
      std::vector<cg_other::cgo_char,_std::allocator<cg_other::cgo_char>_>::
      emplace_back<cg_other::cgo_char>(&this->data,&local_10);
      return;
    }
    uVar2 = uVar2 + 1;
  } while (pcVar1[uVar3].p != p);
  pcVar1[uVar3].ch = ch;
  return;
}

Assistant:

void cg_other::set(point p, int ch) { //TODO
    for (unsigned i = 0; i < data.size(); i++) {
        if (data[i].p == p) {
            data[i].ch = ch;
            return;
        }
    }
    data.push_back({ p, ch });
}